

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void do_tb_phys_invalidate
               (TCGContext_conflict9 *tcg_ctx,TranslationBlock_conflict *tb,_Bool rm_from_page_list)

{
  CPUState_conflict *pCVar1;
  _Bool _Var2;
  uint uVar3;
  PageDesc *pPVar4;
  ulong uVar5;
  TranslationBlock_conflict *pTVar6;
  long lVar7;
  TranslationBlock_conflict *pTVar8;
  ulong uVar9;
  uintptr_t *puVar10;
  uint uVar11;
  PageDesc *pPVar12;
  uint uVar13;
  uint uVar14;
  int line;
  TranslationBlock *tb_00;
  uintptr_t uVar15;
  bool bVar16;
  
  pCVar1 = tcg_ctx->uc->cpu;
  uVar3 = tb->cflags;
  tb->cflags = uVar3 | 0x40000;
  if (((uVar3 >> 0x10 & 1) == 0) &&
     (uVar13 = tb->pc * -0x7a143589 + 1, uVar14 = uVar13 * 0x2000 | uVar13 >> 0x13,
     lVar7 = (ulong)(tb->pc & 0x3fff) + tb->page_addr[0],
     uVar13 = (int)lVar7 * -0x7a143589 + 0x24234429, uVar11 = uVar13 * 0x2000 | uVar13 >> 0x13,
     uVar13 = (int)((ulong)lVar7 >> 0x20) * -0x7a143589 + 0x85ebca78,
     uVar13 = uVar13 * 0x2000 | uVar13 >> 0x13,
     uVar13 = (uVar13 * 0x1bbcd880 | uVar13 * -0x61c8864f >> 0x19) +
              (uVar11 * 0x3c6ef362 | (uint)((int)(uVar11 * -0x61c8864f) < 0)) +
              (uVar14 * 0x779b1000 | uVar14 * -0x61c8864f >> 0x14) + tb->flags * -0x3d4d51c3 +
              0x91a7a6fd,
     uVar3 = (uVar3 & 0xff0affff) * -0x3d4d51c3 + (uVar13 * 0x20000 | uVar13 >> 0xf) * 0x27d4eb2f,
     uVar3 = tb->trace_vcpu_dstate * -0x3d4d51c3 + (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f,
     uVar3 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f,
     uVar3 = (uVar3 >> 0xf ^ uVar3) * -0x7a143589, uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51c3,
     _Var2 = qht_remove(&(tcg_ctx->tb_ctx).htable,tb,uVar3 >> 0x10 ^ uVar3), !_Var2)) {
    return;
  }
  if (rm_from_page_list) {
    pPVar4 = page_find_alloc((uc_struct_conflict15 *)tcg_ctx->uc,tb->page_addr[0] >> 0xe,0);
    uVar9 = pPVar4->first_tb;
    pTVar8 = (TranslationBlock_conflict *)(uVar9 & 0xfffffffffffffffe);
    if (pTVar8 == (TranslationBlock_conflict *)0x0) {
LAB_00d190d5:
      line = 0x586;
      goto LAB_00d190ef;
    }
    pPVar12 = pPVar4;
    if (pTVar8 != tb) {
      do {
        pTVar6 = pTVar8;
        uVar3 = (uint)uVar9 & 1;
        uVar9 = pTVar6->page_next[uVar3];
        pTVar8 = (TranslationBlock_conflict *)(uVar9 & 0xfffffffffffffffe);
        if (pTVar8 == (TranslationBlock_conflict *)0x0) goto LAB_00d190d5;
      } while (pTVar8 != tb);
      pPVar12 = (PageDesc *)(pTVar6->page_next + uVar3);
    }
    pPVar12->first_tb = pTVar8->page_next[(uint)uVar9 & 1];
    g_free(pPVar4->code_bitmap);
    pPVar4->code_bitmap = (unsigned_long *)0x0;
    pPVar4->code_write_count = 0;
    if (tb->page_addr[1] != 0xffffffffffffffff) {
      pPVar4 = page_find_alloc((uc_struct_conflict15 *)tcg_ctx->uc,tb->page_addr[1] >> 0xe,0);
      uVar9 = pPVar4->first_tb;
      pTVar8 = (TranslationBlock_conflict *)(uVar9 & 0xfffffffffffffffe);
      if (pTVar8 == (TranslationBlock_conflict *)0x0) goto LAB_00d190d5;
      pPVar12 = pPVar4;
      if (pTVar8 != tb) {
        do {
          pTVar6 = pTVar8;
          uVar3 = (uint)uVar9 & 1;
          uVar9 = pTVar6->page_next[uVar3];
          pTVar8 = (TranslationBlock_conflict *)(uVar9 & 0xfffffffffffffffe);
          if (pTVar8 == (TranslationBlock_conflict *)0x0) goto LAB_00d190d5;
        } while (pTVar8 != tb);
        pPVar12 = (PageDesc *)(pTVar6->page_next + uVar3);
      }
      pPVar12->first_tb = pTVar8->page_next[(uint)uVar9 & 1];
      g_free(pPVar4->code_bitmap);
      pPVar4->code_bitmap = (unsigned_long *)0x0;
      pPVar4->code_write_count = 0;
    }
  }
  uVar3 = tb->pc >> 8 ^ tb->pc;
  uVar3 = uVar3 & 0x3f | uVar3 >> 8 & 0xfc0;
  if (pCVar1->tb_jmp_cache[uVar3] == tb) {
    pCVar1->tb_jmp_cache[uVar3] = (TranslationBlock_conflict *)0x0;
  }
  uVar9 = tb->jmp_dest[0];
  do {
    LOCK();
    uVar5 = tb->jmp_dest[0];
    bVar16 = uVar9 == uVar5;
    if (bVar16) {
      tb->jmp_dest[0] = uVar9 | 1;
      uVar5 = uVar9;
    }
    UNLOCK();
    uVar9 = uVar5;
  } while (!bVar16);
  uVar9 = uVar5 & 0xfffffffffffffffe;
  if (uVar9 == 0) {
LAB_00d18fe4:
    uVar9 = tb->jmp_dest[1];
    do {
      LOCK();
      uVar5 = tb->jmp_dest[1];
      bVar16 = uVar9 == uVar5;
      if (bVar16) {
        tb->jmp_dest[1] = uVar9 | 1;
        uVar5 = uVar9;
      }
      UNLOCK();
      uVar9 = uVar5;
    } while (!bVar16);
    uVar9 = uVar5 & 0xfffffffffffffffe;
    if (uVar9 == 0) {
LAB_00d19085:
      uVar15 = tb->jmp_list_head;
      while (tb_00 = (TranslationBlock *)(uVar15 & 0xfffffffffffffffe),
            tb_00 != (TranslationBlock *)0x0) {
        uVar3 = (uint)uVar15 & 1;
        tb_set_jmp_target_tricore
                  (tb_00,uVar3,
                   (ulong)tb_00->jmp_reset_offset[(ulong)uVar3 - 4] + *(long *)&tb_00->cflags);
        LOCK();
        tb_00->jmp_list_next[(ulong)uVar3 + 1] = tb_00->jmp_list_next[(ulong)uVar3 + 1] & 1;
        UNLOCK();
        uVar15 = tb_00->jmp_list_next[(ulong)uVar3 - 1];
      }
      tb->jmp_list_head = 0;
      tcg_ctx->tb_phys_invalidate_count = tcg_ctx->tb_phys_invalidate_count + 1;
      return;
    }
    if (tb->jmp_dest[1] != (uVar5 | 1)) {
      if ((tb->jmp_dest[1] != 1) || ((*(byte *)(uVar9 + 0x12) & 4) == 0)) {
LAB_00d190f6:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                   ,0x5a0,"ptr_locked == 1 && dest->cflags & CF_INVALID");
      }
      goto LAB_00d19085;
    }
    uVar5 = *(ulong *)(uVar9 + 0x68);
    pTVar8 = (TranslationBlock_conflict *)(uVar5 & 0xfffffffffffffffe);
    if (pTVar8 != (TranslationBlock_conflict *)0x0) {
      if ((pTVar8 == tb & (byte)uVar5) == 0) {
        do {
          pTVar6 = pTVar8;
          uVar3 = (uint)uVar5 & 1;
          uVar5 = pTVar6->jmp_list_next[uVar3];
          pTVar8 = (TranslationBlock_conflict *)(uVar5 & 0xfffffffffffffffe);
          if (pTVar8 == (TranslationBlock_conflict *)0x0) goto LAB_00d190e3;
        } while ((uVar5 & 1) == 0 || pTVar8 != tb);
        puVar10 = pTVar6->jmp_list_next + uVar3;
      }
      else {
        puVar10 = (uintptr_t *)(uVar9 + 0x68);
      }
      *puVar10 = pTVar8->jmp_list_next[1];
      goto LAB_00d19085;
    }
  }
  else {
    if (tb->jmp_dest[0] != (uVar5 | 1)) {
      if ((tb->jmp_dest[0] != 1) || ((*(byte *)(uVar9 + 0x12) & 4) == 0)) goto LAB_00d190f6;
      goto LAB_00d18fe4;
    }
    uVar5 = *(ulong *)(uVar9 + 0x68);
    pTVar8 = (TranslationBlock_conflict *)(uVar5 & 0xfffffffffffffffe);
    if (pTVar8 != (TranslationBlock_conflict *)0x0) {
      if ((uVar5 & 1) == 0 && pTVar8 == tb) {
        puVar10 = (uintptr_t *)(uVar9 + 0x68);
      }
      else {
        do {
          pTVar6 = pTVar8;
          uVar3 = (uint)uVar5 & 1;
          uVar5 = pTVar6->jmp_list_next[uVar3];
          pTVar8 = (TranslationBlock_conflict *)(uVar5 & 0xfffffffffffffffe);
          if (pTVar8 == (TranslationBlock_conflict *)0x0) goto LAB_00d190e3;
        } while ((uVar5 & 1) != 0 || pTVar8 != tb);
        puVar10 = pTVar6->jmp_list_next + uVar3;
      }
      *puVar10 = pTVar8->jmp_list_next[0];
      goto LAB_00d18fe4;
    }
  }
LAB_00d190e3:
  line = 0x5b0;
LAB_00d190ef:
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
             ,line,(char *)0x0);
}

Assistant:

static void do_tb_phys_invalidate(TCGContext *tcg_ctx, TranslationBlock *tb, bool rm_from_page_list)
{
    CPUState *cpu = tcg_ctx->uc->cpu;
    struct uc_struct *uc = tcg_ctx->uc;
    PageDesc *p;
    uint32_t h;
    tb_page_addr_t phys_pc;
    bool code_gen_locked;

    assert_memory_lock();
    code_gen_locked = tb_exec_is_locked(tcg_ctx);
    tb_exec_unlock(tcg_ctx);

    /* make sure no further incoming jumps will be chained to this TB */
    tb->cflags = tb->cflags | CF_INVALID;

    /* remove the TB from the hash list */
    phys_pc = tb->page_addr[0] + (tb->pc & ~TARGET_PAGE_MASK);
    h = tb_hash_func(phys_pc, tb->pc, tb->flags, tb_cflags(tb) & CF_HASH_MASK,
                     tb->trace_vcpu_dstate);
    if (!(tb->cflags & CF_NOCACHE) &&
        !qht_remove(&tcg_ctx->tb_ctx.htable, tb, h)) {
        tb_exec_change(tcg_ctx, code_gen_locked);
        return;
    }

    /* remove the TB from the page list */
    if (rm_from_page_list) {
        p = page_find(tcg_ctx->uc, tb->page_addr[0] >> TARGET_PAGE_BITS);
        tb_page_remove(p, tb);
        invalidate_page_bitmap(p);
        if (tb->page_addr[1] != -1) {
            p = page_find(tcg_ctx->uc, tb->page_addr[1] >> TARGET_PAGE_BITS);
            tb_page_remove(p, tb);
            invalidate_page_bitmap(p);
        }
    }

    /* remove the TB from the hash list */
    h = tb_jmp_cache_hash_func(uc, tb->pc);
    if (cpu->tb_jmp_cache[h] == tb) {
        cpu->tb_jmp_cache[h] = NULL;
    }

    /* suppress this TB from the two jump lists */
    tb_remove_from_jmp_list(tb, 0);
    tb_remove_from_jmp_list(tb, 1);

    /* suppress any remaining jumps to this TB */
    tb_jmp_unlink(tb);

    tcg_ctx->tb_phys_invalidate_count = tcg_ctx->tb_phys_invalidate_count + 1;

    tb_exec_change(tcg_ctx, code_gen_locked);
}